

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O3

primitive_dictionary_entry_t * __thiscall
duckdb::
PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>::
Lookup(PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
       *this,hugeint_t *value)

{
  bool bVar1;
  hash_t hVar2;
  primitive_dictionary_entry_t *ppVar3;
  int64_t in_RDX;
  ulong uVar4;
  primitive_dictionary_entry_t *this_00;
  hugeint_t val;
  
  val.upper = in_RDX;
  val.lower = value->upper;
  hVar2 = Hash<duckdb::hugeint_t>((duckdb *)value->lower,val);
  uVar4 = hVar2 & this->capacity_mask;
  ppVar3 = this->dictionary;
  if (ppVar3[uVar4].index != 0xffffffff) {
    this_00 = ppVar3 + uVar4;
    do {
      bVar1 = hugeint_t::operator!=(&this_00->value,value);
      ppVar3 = this->dictionary;
      if (!bVar1) break;
      uVar4 = uVar4 + 1 & this->capacity_mask;
      this_00 = ppVar3 + uVar4;
    } while (this_00->index != 0xffffffff);
  }
  return ppVar3 + uVar4;
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}